

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::rasterization::anon_unknown_0::TriangleInterpolationTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TriangleInterpolationTestInstance *this)

{
  pointer pSVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  deUint32 width;
  VkPrimitiveTopology VVar3;
  TestLog *log;
  undefined1 auVar4 [16];
  TriangleInterpolationTestInstance *pTVar5;
  TestStatus *pTVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  int iVar9;
  long *plVar10;
  undefined8 *puVar11;
  pointer pVVar12;
  pointer pVVar13;
  ulong *puVar14;
  size_type *psVar15;
  float *pfVar16;
  long lVar17;
  undefined8 uVar18;
  pointer pSVar19;
  ulong uVar20;
  long lVar21;
  long lVar22;
  float fVar23;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> drawBuffer;
  Surface resultImage;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> colorBuffer;
  string iterationDescription;
  ScopedLogSection section;
  IVec4 colorBits;
  undefined1 local_298 [24];
  long lStack_280;
  TriangleInterpolationTestInstance *local_270;
  string local_268;
  undefined1 local_248 [32];
  undefined1 local_228 [32];
  string local_208;
  ScopedLogSection local_1e8;
  TestStatus *local_1e0;
  undefined1 local_1d8 [8];
  pointer pSStack_1d0;
  undefined1 local_1c8 [80];
  undefined2 local_178;
  bool local_176;
  ios_base local_168 [8];
  ios_base local_160 [264];
  tcu local_58 [8];
  int local_50;
  RasterizationArguments local_44;
  
  iVar9 = this->m_iteration;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<((ostringstream *)local_1d8,iVar9 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_228,0,(char *)0x0,0xb50840);
  pVVar12 = (pointer)(local_298 + 0x10);
  pVVar13 = (pointer)(plVar10 + 2);
  if ((pointer)*plVar10 == pVVar13) {
    local_298._16_8_ = *(undefined8 *)pVVar13->m_data;
    lStack_280 = plVar10[3];
    local_298._0_8_ = pVVar12;
  }
  else {
    local_298._16_8_ = *(undefined8 *)pVVar13->m_data;
    local_298._0_8_ = (pointer)*plVar10;
  }
  local_298._8_8_ = plVar10[1];
  *plVar10 = (long)pVVar13;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  plVar10 = (long *)std::__cxx11::string::append(local_298);
  paVar2 = &local_268.field_2;
  puVar14 = (ulong *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar14) {
    local_268.field_2._M_allocated_capacity = *puVar14;
    local_268.field_2._8_8_ = plVar10[3];
    local_268._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *puVar14;
    local_268._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_268._M_string_length = plVar10[1];
  *plVar10 = (long)puVar14;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<(local_1d8,this->m_iterationCount);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  pSVar1 = (pointer)((long)((Vec4 *)local_248._8_8_)->m_data + local_268._M_string_length);
  uVar18 = (pointer)0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    uVar18 = local_268.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < pSVar1) {
    pSVar19 = (pointer)0xf;
    if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
      pSVar19 = (pointer)local_248._16_8_;
    }
    if (pSVar1 <= pSVar19) {
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)local_248,0,(char *)0x0,(ulong)local_268._M_dataplus._M_p);
      goto LAB_007c8b75;
    }
  }
  puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_268,local_248._0_8_);
LAB_007c8b75:
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  psVar15 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_208.field_2._M_allocated_capacity = *psVar15;
    local_208.field_2._8_8_ = puVar11[3];
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar15;
    local_208._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_208._M_string_length = puVar11[1];
  *puVar11 = psVar15;
  puVar11[1] = 0;
  *(undefined1 *)psVar15 = 0;
  if ((pointer)local_248._0_8_ != (pointer)(local_248 + 0x10)) {
    operator_delete((void *)local_248._0_8_,(ulong)((long)((Vec4 *)local_248._16_8_)->m_data + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_298._0_8_ != pVVar12) {
    operator_delete((void *)local_298._0_8_,(ulong)((long)(float *)local_298._16_8_ + 1));
  }
  if ((pointer)local_228._0_8_ != (pointer)(local_228 + 0x10)) {
    operator_delete((void *)local_228._0_8_,(ulong)((long)(float *)local_228._16_8_ + 1));
  }
  log = ((this->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
  iVar9 = this->m_iteration;
  local_270 = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1d8);
  std::ostream::operator<<(local_1d8,iVar9 + 1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1d8);
  std::ios_base::~ios_base(local_168);
  plVar10 = (long *)std::__cxx11::string::replace((ulong)local_298,0,(char *)0x0,0xb28e9c);
  pTVar5 = local_270;
  psVar15 = (size_type *)(plVar10 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar15) {
    local_268.field_2._M_allocated_capacity = *psVar15;
    local_268.field_2._8_8_ = plVar10[3];
    local_268._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_268.field_2._M_allocated_capacity = *psVar15;
    local_268._M_dataplus._M_p = (pointer)*plVar10;
  }
  local_268._M_string_length = plVar10[1];
  *plVar10 = (long)psVar15;
  plVar10[1] = 0;
  *(undefined1 *)(plVar10 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,&local_268,&local_208);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != paVar2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_298._0_8_ != pVVar12) {
    operator_delete((void *)local_298._0_8_,(ulong)((long)(float *)local_298._16_8_ + 1));
  }
  width = (pTVar5->super_BaseRenderingTestInstance).m_renderSize;
  tcu::Surface::Surface((Surface *)&local_268,width,width);
  local_298._0_8_ = (pointer)0x0;
  local_298._8_8_ = (pointer)0x0;
  local_298._16_8_ = (pointer)0x0;
  local_228._16_8_ = (pointer)0x0;
  local_228._0_8_ = (pointer)0x0;
  local_228._8_8_ = (pointer)0x0;
  local_248._16_8_ = (pointer)0x0;
  local_248._0_8_ = (pointer)0x0;
  local_248._8_8_ = (pointer)0x0;
  local_1d8 = (undefined1  [8])0x3f800000;
  pSStack_1d0 = (pointer)0x3f80000000000000;
  local_1c8._0_8_ = (pointer)0x3f80000000000000;
  local_1c8._8_4_ = 0.0;
  local_1c8._12_4_ = 1.0;
  local_1c8._16_4_ = 0.0;
  local_1c8._20_4_ = 0.0;
  local_1c8._24_4_ = 1.0;
  local_1c8._28_4_ = 1.0;
  deRandom_init((deRandom *)&local_44,
                pTVar5->m_iteration * 1000 + pTVar5->m_primitiveTopology + 0x7b);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_298,6);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,6);
  local_1e0 = __return_storage_ptr__;
  if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4)) {
    lVar22 = 0;
    uVar20 = 0;
    do {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar20;
      fVar23 = deRandom_getFloat((deRandom *)&local_44);
      *(float *)((long)(float *)local_298._0_8_ + lVar22) = fVar23 * 1.8 + -0.9;
      fVar23 = deRandom_getFloat((deRandom *)&local_44);
      *(float *)((long)(float *)local_298._0_8_ + lVar22 + 4) = fVar23 * 1.8 + -0.9;
      *(undefined4 *)((long)(float *)local_298._0_8_ + lVar22 + 8) = 0;
      fVar23 = 1.0;
      if (pTVar5->m_projective == true) {
        fVar23 = deRandom_getFloat((deRandom *)&local_44);
        fVar23 = fVar23 * 3.8 + 0.2;
        uVar18 = *(undefined8 *)((long)(float *)local_298._0_8_ + lVar22);
        *(ulong *)((long)(float *)local_298._0_8_ + lVar22) =
             CONCAT44(fVar23 * (float)((ulong)uVar18 >> 0x20),fVar23 * (float)uVar18);
        *(float *)((long)(float *)local_298._0_8_ + lVar22 + 8) =
             *(float *)((long)(float *)local_298._0_8_ + lVar22 + 8) * fVar23;
      }
      *(float *)((long)(float *)local_298._0_8_ + lVar22 + 0xc) = fVar23;
      uVar18 = *(undefined8 *)
                ((long)(local_1d8 +
                       lVar22 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe
                                ) * -0x18) + 8);
      puVar11 = (undefined8 *)((long)(float *)local_228._0_8_ + lVar22);
      *puVar11 = *(undefined8 *)
                  (local_1d8 +
                  lVar22 + (SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),8) & 0x1ffffffffffffffe) *
                           -0x18);
      puVar11[1] = uVar18;
      uVar20 = uVar20 + 1;
      lVar22 = lVar22 + 0x10;
    } while ((long)uVar20 < (long)(int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4));
  }
  VVar3 = pTVar5->m_primitiveTopology;
  if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
    if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -2) {
      iVar9 = 0;
      do {
        local_1d8 = *(undefined1 (*) [8])((pointer)(local_298._0_8_ + (long)iVar9 * 0x10))->m_data;
        pSStack_1d0 = *(pointer *)(((pointer)(local_298._0_8_ + (long)iVar9 * 0x10))->m_data + 2);
        local_1c8._0_8_ =
             *(undefined8 *)((pointer)(local_298._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data;
        local_1c8._8_8_ =
             *(undefined8 *)(((pointer)(local_298._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data + 2);
        local_1c8._16_8_ =
             *(undefined8 *)((pointer)(local_298._0_8_ + (long)(iVar9 + 2) * 0x10))->m_data;
        local_1c8._24_8_ =
             *(undefined8 *)(((pointer)(local_298._0_8_ + (long)(iVar9 + 2) * 0x10))->m_data + 2);
        local_178._0_1_ = false;
        local_178._1_1_ = false;
        local_176 = false;
        local_1c8._32_8_ = *(undefined8 *)((pointer)(local_228._0_8_ + (long)iVar9 * 0x10))->m_data;
        local_1c8._40_8_ =
             *(undefined8 *)(((pointer)(local_228._0_8_ + (long)iVar9 * 0x10))->m_data + 2);
        if (local_270->m_flatshade == 0) {
          local_1c8._48_8_ =
               *(undefined8 *)((pointer)(local_228._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data;
          local_1c8._56_8_ =
               *(undefined8 *)(((pointer)(local_228._0_8_ + (long)(iVar9 + 1) * 0x10))->m_data + 2);
          pVVar12 = (pointer)(local_228._0_8_ + (long)(iVar9 + 2) * 0x10);
        }
        else {
          pVVar12 = (pointer)(local_228._0_8_ + (long)iVar9 * 0x10);
          local_1c8._48_8_ = *(undefined8 *)pVVar12->m_data;
          local_1c8._56_8_ = *(undefined8 *)(pVVar12->m_data + 2);
        }
        local_1c8._64_8_ = *(undefined8 *)pVVar12->m_data;
        local_1c8._72_8_ = *(undefined8 *)(pVVar12->m_data + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_248,(value_type *)local_1d8);
        iVar9 = iVar9 + 3;
      } while (iVar9 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -2);
    }
  }
  else if (VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
    if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -2) {
      lVar21 = 0x200000000;
      lVar17 = 0;
      lVar22 = 0;
      do {
        pfVar16 = (float *)((long)(float *)local_298._0_8_ + lVar17);
        local_1d8 = *(undefined1 (*) [8])pfVar16;
        pSStack_1d0 = *(pointer *)(pfVar16 + 2);
        pfVar16 = (float *)((long)((pointer)(local_298._0_8_ + 0x10))->m_data + lVar17);
        local_1c8._0_8_ = *(undefined8 *)pfVar16;
        local_1c8._8_8_ = *(undefined8 *)(pfVar16 + 2);
        pfVar16 = (float *)((long)(float *)local_298._0_8_ + (lVar21 >> 0x1c));
        local_1c8._16_8_ = *(undefined8 *)pfVar16;
        local_1c8._24_8_ = *(undefined8 *)(pfVar16 + 2);
        local_178._0_1_ = false;
        local_178._1_1_ = false;
        local_176 = false;
        pfVar16 = (float *)((long)(float *)local_228._0_8_ + lVar17);
        local_1c8._32_8_ = *(undefined8 *)pfVar16;
        local_1c8._40_8_ = *(undefined8 *)(pfVar16 + 2);
        if (local_270->m_flatshade == 0) {
          pfVar16 = (float *)((long)((pointer)(local_228._0_8_ + 0x10))->m_data + lVar17);
          local_1c8._48_8_ = *(undefined8 *)pfVar16;
          local_1c8._56_8_ = *(undefined8 *)(pfVar16 + 2);
          pVVar12 = (pointer)(local_228._0_8_ + (lVar21 >> 0x20) * 0x10);
        }
        else {
          pVVar12 = (pointer)((long)(float *)local_228._0_8_ + lVar17);
          local_1c8._48_8_ = *(undefined8 *)pVVar12->m_data;
          local_1c8._56_8_ = *(undefined8 *)(pVVar12->m_data + 2);
        }
        local_1c8._64_8_ = *(undefined8 *)pVVar12->m_data;
        local_1c8._72_8_ = *(undefined8 *)(pVVar12->m_data + 2);
        std::
        vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
        ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                     *)local_248,(value_type *)local_1d8);
        lVar22 = lVar22 + 1;
        lVar21 = lVar21 + 0x100000000;
        lVar17 = lVar17 + 0x10;
      } while (lVar22 < (local_298._8_8_ - local_298._0_8_) * 0x10000000 + -0x200000000 >> 0x20);
    }
  }
  else if ((VVar3 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN) &&
          (1 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4) + -1)) {
    lVar22 = 1;
    lVar21 = 0x10;
    do {
      local_1d8 = *(undefined1 (*) [8])(float *)local_298._0_8_;
      pSStack_1d0 = *(pointer *)((float *)local_298._0_8_ + 2);
      pfVar16 = (float *)((long)(float *)local_298._0_8_ + lVar21);
      local_1c8._0_8_ = *(undefined8 *)pfVar16;
      local_1c8._8_8_ = *(undefined8 *)(pfVar16 + 2);
      lVar22 = lVar22 + 1;
      pfVar16 = (float *)((long)((pointer)(local_298._0_8_ + 0x10))->m_data + lVar21);
      local_1c8._16_8_ = *(undefined8 *)pfVar16;
      local_1c8._24_8_ = *(undefined8 *)(pfVar16 + 2);
      local_178._0_1_ = false;
      local_178._1_1_ = false;
      local_176 = false;
      if (local_270->m_flatshade == 0) {
        local_1c8._32_8_ = *(undefined8 *)(float *)local_228._0_8_;
        local_1c8._40_8_ = *(undefined8 *)((float *)local_228._0_8_ + 2);
        pfVar16 = (float *)((long)(float *)local_228._0_8_ + lVar21);
        local_1c8._48_8_ = *(undefined8 *)pfVar16;
        local_1c8._56_8_ = *(undefined8 *)(pfVar16 + 2);
        lVar17 = lVar22 * 0x10;
      }
      else {
        pfVar16 = (float *)((long)(float *)local_228._0_8_ + lVar21);
        local_1c8._32_8_ = *(undefined8 *)pfVar16;
        local_1c8._40_8_ = *(undefined8 *)(pfVar16 + 2);
        pfVar16 = (float *)((long)(float *)local_228._0_8_ + lVar21);
        local_1c8._48_8_ = *(undefined8 *)pfVar16;
        local_1c8._56_8_ = *(undefined8 *)(pfVar16 + 2);
        lVar17 = lVar21;
      }
      pfVar16 = (float *)((long)(float *)local_228._0_8_ + lVar17);
      local_1c8._64_8_ = *(undefined8 *)pfVar16;
      local_1c8._72_8_ = *(undefined8 *)(pfVar16 + 2);
      std::
      vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ::push_back((vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                   *)local_248,(value_type *)local_1d8);
      lVar21 = lVar21 + 0x10;
    } while (lVar22 < (local_298._8_8_ - local_298._0_8_) * 0x10000000 + -0x100000000 >> 0x20);
  }
  local_1d8 = (undefined1  [8])
              ((local_270->super_BaseRenderingTestInstance).super_TestInstance.m_context)->m_testCtx
              ->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&pSStack_1d0,"Generated vertices:",0x13);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1d0);
  std::ios_base::~ios_base(local_160);
  if (0 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4)) {
    lVar21 = 0;
    lVar22 = 0;
    do {
      local_1d8 = (undefined1  [8])
                  ((local_270->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                  m_testCtx->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&pSStack_1d0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1d0,"\t",1);
      tcu::operator<<((ostream *)&pSStack_1d0,
                      (Vector<float,_4> *)((long)(float *)local_298._0_8_ + lVar21));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pSStack_1d0,",\tcolor= ",9);
      tcu::operator<<((ostream *)&pSStack_1d0,
                      (Vector<float,_4> *)((long)(float *)local_228._0_8_ + lVar21));
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1d8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pSStack_1d0);
      std::ios_base::~ios_base(local_160);
      lVar22 = lVar22 + 1;
      lVar21 = lVar21 + 0x10;
    } while (lVar22 < (int)((ulong)(local_298._8_8_ - local_298._0_8_) >> 4));
  }
  pTVar5 = local_270;
  BaseRenderingTestInstance::drawPrimitives
            (&local_270->super_BaseRenderingTestInstance,(Surface *)&local_268,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_298,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_228,
             local_270->m_primitiveTopology);
  pTVar6 = local_1e0;
  local_1d8 = (undefined1  [8])0x0;
  pSStack_1d0 = (pointer)0x0;
  local_1c8._0_8_ = (pointer)0x0;
  tcu::getTextureFormatBitDepth(local_58,&(pTVar5->super_BaseRenderingTestInstance).m_textureFormat)
  ;
  uVar18 = local_1c8._0_8_;
  pSVar1 = pSStack_1d0;
  auVar7 = local_1d8;
  local_44.numSamples = (int)((pTVar5->super_BaseRenderingTestInstance).m_multisampling != 0);
  local_44.subpixelBits = (pTVar5->super_BaseRenderingTestInstance).m_subpixelBits;
  local_44._8_8_ = local_58;
  local_44.blueBits = local_50;
  local_1c8._0_8_ = local_248._16_8_;
  local_1d8 = (undefined1  [8])local_248._0_8_;
  pSStack_1d0 = (pointer)local_248._8_8_;
  local_248._0_8_ = auVar7;
  local_248._8_8_ = pSVar1;
  local_248._16_8_ = uVar18;
  bVar8 = tcu::verifyTriangleGroupInterpolation
                    ((Surface *)&local_268,(TriangleSceneSpec *)local_1d8,&local_44,
                     ((pTVar5->super_BaseRenderingTestInstance).super_TestInstance.m_context)->
                     m_testCtx->m_log);
  if (!bVar8) {
    pTVar5->m_allIterationsPassed = false;
  }
  if (local_1d8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1d8,local_1c8._0_8_ - (long)local_1d8);
  }
  iVar9 = pTVar5->m_iteration + 1;
  pTVar5->m_iteration = iVar9;
  if (iVar9 == pTVar5->m_iterationCount) {
    if (pTVar5->m_allIterationsPassed == true) {
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"Pass","");
      pTVar6->m_code = QP_TEST_RESULT_PASS;
      (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar6->m_description,local_1d8,
                 (undefined1 *)
                 ((long)pSStack_1d0->positions[0].m_data + (long)((Vec4 *)local_1d8)->m_data));
    }
    else {
      local_1d8 = (undefined1  [8])local_1c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1d8,"Found invalid pixel values","");
      pTVar6->m_code = QP_TEST_RESULT_FAIL;
      (pTVar6->m_description)._M_dataplus._M_p = (pointer)&(pTVar6->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&pTVar6->m_description,local_1d8,
                 (undefined1 *)
                 ((long)pSStack_1d0->positions[0].m_data + (long)((Vec4 *)local_1d8)->m_data));
    }
    if (local_1d8 != (undefined1  [8])local_1c8) {
      operator_delete((void *)local_1d8,(ulong)((long)((Vec4 *)local_1c8._0_8_)->m_data + 1));
    }
  }
  else {
    tcu::TestStatus::incomplete();
  }
  if ((pointer)local_248._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_248._0_8_,local_248._16_8_ - local_248._0_8_);
  }
  if ((pointer)local_228._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_228._0_8_,local_228._16_8_ - local_228._0_8_);
  }
  if ((pointer)local_298._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ - local_298._0_8_);
  }
  tcu::Surface::~Surface((Surface *)&local_268);
  tcu::TestLog::endSection(local_1e8.m_log);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  return pTVar6;
}

Assistant:

tcu::TestStatus TriangleInterpolationTestInstance::iterate (void)
{
	const std::string								iterationDescription	= "Test iteration " + de::toString(m_iteration+1) + " / " + de::toString(m_iterationCount);
	const tcu::ScopedLogSection						section					(m_context.getTestContext().getLog(), "Iteration" + de::toString(m_iteration+1), iterationDescription);
	tcu::Surface									resultImage				(m_renderSize, m_renderSize);
	std::vector<tcu::Vec4>							drawBuffer;
	std::vector<tcu::Vec4>							colorBuffer;
	std::vector<TriangleSceneSpec::SceneTriangle>	triangles;

	// generate scene
	generateVertices(m_iteration, drawBuffer, colorBuffer);
	extractTriangles(triangles, drawBuffer, colorBuffer);

	// log
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Generated vertices:" << tcu::TestLog::EndMessage;
		for (int vtxNdx = 0; vtxNdx < (int)drawBuffer.size(); ++vtxNdx)
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "\t" << drawBuffer[vtxNdx] << ",\tcolor= " << colorBuffer[vtxNdx] << tcu::TestLog::EndMessage;
	}

	// draw image
	drawPrimitives(resultImage, drawBuffer, colorBuffer, m_primitiveTopology);

	// compare
	{
		RasterizationArguments	args;
		TriangleSceneSpec		scene;
		tcu::IVec4				colorBits	= tcu::getTextureFormatBitDepth(getTextureFormat());

		args.numSamples		= m_multisampling ? 1 : 0;
		args.subpixelBits	= m_subpixelBits;
		args.redBits		= colorBits[0];
		args.greenBits		= colorBits[1];
		args.blueBits		= colorBits[2];

		scene.triangles.swap(triangles);

		if (!verifyTriangleGroupInterpolation(resultImage, scene, args, m_context.getTestContext().getLog()))
			m_allIterationsPassed = false;
	}

	// result
	if (++m_iteration == m_iterationCount)
	{
		if (m_allIterationsPassed)
			return tcu::TestStatus::pass("Pass");
		else
			return tcu::TestStatus::fail("Found invalid pixel values");
	}
	else
		return tcu::TestStatus::incomplete();
}